

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int ecdh_hash_function_sha256(uchar *output,uchar *x32,uchar *y32,void *data)

{
  undefined1 local_98 [8];
  secp256k1_sha256 sha;
  uchar version;
  void *data_local;
  uchar *y32_local;
  uchar *x32_local;
  uchar *output_local;
  
  sha.bytes._7_1_ = y32[0x1f] & 1 | 2;
  secp256k1_sha256_initialize((secp256k1_sha256 *)local_98);
  secp256k1_sha256_write((secp256k1_sha256 *)local_98,(uchar *)((long)&sha.bytes + 7),1);
  secp256k1_sha256_write((secp256k1_sha256 *)local_98,x32,0x20);
  secp256k1_sha256_finalize((secp256k1_sha256 *)local_98,output);
  return 1;
}

Assistant:

static int ecdh_hash_function_sha256(unsigned char *output, const unsigned char *x32, const unsigned char *y32, void *data) {
    unsigned char version = (y32[31] & 0x01) | 0x02;
    secp256k1_sha256 sha;
    (void)data;

    secp256k1_sha256_initialize(&sha);
    secp256k1_sha256_write(&sha, &version, 1);
    secp256k1_sha256_write(&sha, x32, 32);
    secp256k1_sha256_finalize(&sha, output);

    return 1;
}